

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

TimerHolder __thiscall
Liby::TimerQueue::insert(TimerQueue *this,Timestamp *timeout,BasicHandler *handler)

{
  _Atomic_word *p_Var1;
  BasicHandler *pBVar2;
  int iVar3;
  function<void_()> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  TimerHolder TVar5;
  WeakTimerHolder weak_holder;
  WeakTimerHolder WStack_68;
  
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Liby::Timer,std::allocator<Liby::Timer>,Liby::Timestamp_const&,std::function<void()>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->timerfp_,(Timer **)this,
             (allocator<Liby::Timer> *)&WStack_68,(Timestamp *)handler,in_RCX);
  WeakTimerHolder::WeakTimerHolder(&WStack_68,(TimerHolder *)this);
  if ((int)timeout[2].tv_.tv_usec == 0) {
    updateTimerfd((TimerQueue *)timeout,(Timestamp *)handler);
  }
  BinaryHeap<Liby::WeakTimerHolder>::insert
            ((BinaryHeap<Liby::WeakTimerHolder> *)&timeout[2].tv_.tv_usec,&WStack_68);
  _Var4._M_pi = extraout_RDX;
  if (WStack_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(WStack_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (WStack_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (WStack_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(WStack_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      _Var4._M_pi = extraout_RDX_00;
    }
  }
  if (WStack_68.timer_.handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
    pBVar2 = &WStack_68.timer_.handler_;
    (*WStack_68.timer_.handler_.super__Function_base._M_manager)
              ((_Any_data *)pBVar2,(_Any_data *)pBVar2,__destroy_functor);
    _Var4._M_pi = extraout_RDX_01;
  }
  TVar5.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  TVar5.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TimerHolder)TVar5.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerHolder TimerQueue::insert(const Timestamp &timeout,
                               const BasicHandler &handler) {
    TimerHolder holder(timeout, handler);
    WeakTimerHolder weak_holder(holder);

    if (queue_.empty()) {
        updateTimerfd(timeout);
    }

    queue_.insert(weak_holder);
    return holder;
}